

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coverage.cpp
# Opt level: O2

void __thiscall
Coverage_analyserTypes_Test::Coverage_analyserTypes_Test(Coverage_analyserTypes_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_0012d350;
  return;
}

Assistant:

TEST(Coverage, analyserTypes)
{
    auto analyser = libcellml::Analyser::create();
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    analyser->analyseModel(model);

    auto analyserModel = analyser->model();

    EXPECT_EQ("algebraic", libcellml::AnalyserEquation::typeAsString(analyserModel->equation(0)->type()));
    EXPECT_EQ("algebraic", libcellml::AnalyserVariable::typeAsString(analyserModel->variable(0)->type()));
}